

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O2

_Bool sesschan_change_window_size(Channel *chan,uint width,uint height,uint pixwidth,uint pixheight)

{
  char cVar1;
  
  cVar1 = *(char *)&chan[-0x5a].vt;
  if (cVar1 == '\x01') {
    *(uint *)&chan[-9].vt = width;
    *(uint *)((long)&chan[-9].vt + 4) = height;
    chan[-9].initial_fixed_window_size = pixwidth;
    *(uint *)&chan[-9].field_0xc = pixheight;
    if (*(long **)&chan[-5].initial_fixed_window_size != (long *)0x0) {
      (**(code **)(**(long **)&chan[-5].initial_fixed_window_size + 0x28))();
    }
  }
  return (_Bool)cVar1;
}

Assistant:

bool sesschan_change_window_size(
    Channel *chan, unsigned width, unsigned height,
    unsigned pixwidth, unsigned pixheight)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    if (!sess->want_pty)
        return false;

    sess->wc = width;
    sess->hc = height;
    sess->wp = pixwidth;
    sess->hp = pixheight;

    if (sess->backend)
        backend_size(sess->backend, sess->wc, sess->hc);

    return true;
}